

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O0

FT_Error ft_smooth_render_generic
                   (FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                   FT_Vector *origin,FT_Render_Mode required_mode)

{
  uint uVar1;
  FT_Memory memory_00;
  long lVar2;
  int iVar3;
  uint uVar4;
  FT_Outline *outline_00;
  FT_Bitmap *pFVar5;
  uchar *puVar6;
  long lVar7;
  FT_Pointer P;
  int pitch_1;
  int pitch;
  uint width;
  uint height;
  FT_UInt j;
  FT_UInt i;
  FT_Byte *temp;
  FT_Byte *line;
  FT_Raster_Params params;
  FT_Int vmul;
  FT_Int hmul;
  FT_Pos y_shift;
  FT_Pos x_shift;
  FT_Memory memory;
  FT_Bitmap *bitmap;
  FT_Outline *outline;
  FT_Error error;
  FT_Render_Mode required_mode_local;
  FT_Vector *origin_local;
  FT_GlyphSlot pFStack_18;
  FT_Render_Mode mode_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict render_local;
  
  outline._0_4_ = 0;
  outline_00 = &slot->outline;
  pFVar5 = &slot->bitmap;
  memory_00 = (render->root).memory;
  y_shift = 0;
  _vmul = 0;
  params.clip_box.yMax._4_4_ = (uint)(mode == FT_RENDER_MODE_LCD);
  params.clip_box.yMax._0_4_ = (uint)(mode == FT_RENDER_MODE_LCD_V);
  lVar2 = _vmul;
  lVar7 = y_shift;
  outline._4_4_ = required_mode;
  _error = origin;
  origin_local._4_4_ = mode;
  pFStack_18 = slot;
  slot_local = (FT_GlyphSlot)render;
  if (slot->format == render->glyph_format) {
    if (mode == required_mode) {
      if ((slot->internal->flags & 1) != 0) {
        ft_mem_free(memory_00,(slot->bitmap).buffer);
        (slot->bitmap).buffer = (uchar *)0x0;
        pFStack_18->internal->flags = pFStack_18->internal->flags & 0xfffffffe;
      }
      ft_glyphslot_preset_bitmap(pFStack_18,origin_local._4_4_,_error);
      puVar6 = (uchar *)ft_mem_realloc(memory_00,(long)(slot->bitmap).pitch,0,(ulong)pFVar5->rows,
                                       (void *)0x0,(FT_Error *)&outline);
      (slot->bitmap).buffer = puVar6;
      if ((int)outline == 0) {
        pFStack_18->internal->flags = pFStack_18->internal->flags | 1;
        y_shift = (FT_Pos)(pFStack_18->bitmap_left * -0x40);
        if ((slot->bitmap).pixel_mode == '\x06') {
          iVar3 = (int)(pFVar5->rows << 6) / 3;
        }
        else {
          iVar3 = pFVar5->rows << 6;
        }
        _vmul = (long)iVar3 + (long)(pFStack_18->bitmap_top * -0x40);
        if (_error != (FT_Vector *)0x0) {
          y_shift = _error->x + y_shift;
          _vmul = _error->y + _vmul;
        }
        if ((y_shift != 0) || (_vmul != 0)) {
          FT_Outline_Translate(outline_00,y_shift,_vmul);
        }
        params.source._0_4_ = 1;
        line = (FT_Byte *)pFVar5;
        params.target = (FT_Bitmap *)outline_00;
        lVar2 = _vmul;
        lVar7 = y_shift;
        if (params.clip_box.yMax._4_4_ == 0) {
          if ((uint)params.clip_box.yMax == 0) {
            outline._0_4_ =
                 (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&line);
          }
          else {
            iVar3 = (slot->bitmap).pitch;
            (slot->bitmap).pitch = (slot->bitmap).pitch * 3;
            pFVar5->rows = pFVar5->rows / 3;
            (slot->bitmap).buffer = (slot->bitmap).buffer + iVar3;
            outline._0_4_ =
                 (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&line);
            if ((int)outline == 0) {
              FT_Outline_Translate(outline_00,0,0x15);
              (slot->bitmap).buffer = (slot->bitmap).buffer + iVar3;
              outline._0_4_ =
                   (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&line)
              ;
              lVar2 = _vmul + 0x15;
              if ((int)outline == 0) {
                FT_Outline_Translate(outline_00,0,-0x2a);
                (slot->bitmap).buffer = (slot->bitmap).buffer + -(long)(iVar3 << 1);
                outline._0_4_ =
                     (*(code *)slot_local->linearHoriAdvance)
                               ((slot_local->metrics).vertAdvance,&line);
                lVar2 = _vmul + -0x15;
                if ((int)outline == 0) {
                  (slot->bitmap).pitch = (slot->bitmap).pitch / 3;
                  pFVar5->rows = pFVar5->rows * 3;
                }
              }
            }
          }
        }
        else {
          uVar1 = pFVar5->rows;
          iVar3 = (slot->bitmap).pitch;
          uVar4 = (slot->bitmap).width / 3;
          (slot->bitmap).buffer = (slot->bitmap).buffer + uVar4;
          outline._0_4_ =
               (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&line);
          if ((int)outline == 0) {
            FT_Outline_Translate(outline_00,-0x15,0);
            (slot->bitmap).buffer = (slot->bitmap).buffer + uVar4;
            outline._0_4_ =
                 (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&line);
            lVar7 = y_shift + -0x15;
            if ((int)outline == 0) {
              FT_Outline_Translate(outline_00,0x2a,0);
              lVar7 = y_shift + 0x15;
              (slot->bitmap).buffer = (slot->bitmap).buffer + -(ulong)(uVar4 << 1);
              outline._0_4_ =
                   (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&line)
              ;
              if (((int)outline == 0) &&
                 (P = ft_mem_alloc(memory_00,(long)iVar3,(FT_Error *)&outline), (int)outline == 0))
              {
                for (height = 0; height < uVar1; height = height + 1) {
                  puVar6 = (slot->bitmap).buffer + (ulong)height * (long)iVar3;
                  for (width = 0; width < uVar4; width = width + 1) {
                    *(uchar *)((long)P + (ulong)(width * 3)) = puVar6[width];
                    *(uchar *)((long)P + (ulong)(width * 3 + 1)) = puVar6[width + uVar4];
                    *(uchar *)((long)P + (ulong)(width * 3 + 2)) = puVar6[width + uVar4 * 2];
                  }
                  memcpy(puVar6,P,(long)iVar3);
                }
                ft_mem_free(memory_00,P);
              }
            }
          }
        }
      }
    }
    else {
      outline._0_4_ = 0x13;
    }
  }
  else {
    outline._0_4_ = 6;
  }
  y_shift = lVar7;
  _vmul = lVar2;
  if ((int)outline == 0) {
    pFStack_18->format = FT_GLYPH_FORMAT_BITMAP;
  }
  else if ((pFStack_18->internal->flags & 1) != 0) {
    ft_mem_free(memory_00,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFStack_18->internal->flags = pFStack_18->internal->flags & 0xfffffffe;
  }
  if ((y_shift != 0) || (_vmul != 0)) {
    FT_Outline_Translate(outline_00,-y_shift,-_vmul);
  }
  return (int)outline;
}

Assistant:

static FT_Error
  ft_smooth_render_generic( FT_Renderer       render,
                            FT_GlyphSlot      slot,
                            FT_Render_Mode    mode,
                            const FT_Vector*  origin,
                            FT_Render_Mode    required_mode )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;
    FT_Int       hmul    = ( mode == FT_RENDER_MODE_LCD );
    FT_Int       vmul    = ( mode == FT_RENDER_MODE_LCD_V );

    FT_Raster_Params  params;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check mode */
    if ( mode != required_mode )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    ft_glyphslot_preset_bitmap( slot, mode, origin );

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = 64 * -slot->bitmap_left;
    y_shift = 64 * -slot->bitmap_top;
    if ( bitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      y_shift += 64 * (FT_Int)bitmap->rows / 3;
    else
      y_shift += 64 * (FT_Int)bitmap->rows;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    /* set up parameters */
    params.target = bitmap;
    params.source = outline;
    params.flags  = FT_RASTER_FLAG_AA;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING

    /* implode outline if needed */
    {
      FT_Vector*  points     = outline->points;
      FT_Vector*  points_end = points + outline->n_points;
      FT_Vector*  vec;


      if ( hmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->x *= 3;

      if ( vmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->y *= 3;
    }

    /* render outline into the bitmap */
    error = render->raster_render( render->raster, &params );

    /* deflate outline if needed */
    {
      FT_Vector*  points     = outline->points;
      FT_Vector*  points_end = points + outline->n_points;
      FT_Vector*  vec;


      if ( hmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->x /= 3;

      if ( vmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->y /= 3;
    }

    if ( error )
      goto Exit;

    /* finally apply filtering */
    if ( hmul || vmul )
    {
      FT_Byte*                 lcd_weights;
      FT_Bitmap_LcdFilterFunc  lcd_filter_func;


      /* Per-face LCD filtering takes priority if set up. */
      if ( slot->face && slot->face->internal->lcd_filter_func )
      {
        lcd_weights     = slot->face->internal->lcd_weights;
        lcd_filter_func = slot->face->internal->lcd_filter_func;
      }
      else
      {
        lcd_weights     = slot->library->lcd_weights;
        lcd_filter_func = slot->library->lcd_filter_func;
      }

      if ( lcd_filter_func )
        lcd_filter_func( bitmap, mode, lcd_weights );
    }

#else /* !FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

    if ( hmul )  /* lcd */
    {
      FT_Byte*  line;
      FT_Byte*  temp = NULL;
      FT_UInt   i, j;

      unsigned int  height = bitmap->rows;
      unsigned int  width  = bitmap->width;
      int           pitch  = bitmap->pitch;


      /* Render 3 separate monochrome bitmaps, shifting the outline  */
      /* by 1/3 pixel.                                               */
      width /= 3;

      bitmap->buffer += width;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline, -21, 0 );
      x_shift        -= 21;
      bitmap->buffer += width;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline,  42, 0 );
      x_shift        += 42;
      bitmap->buffer -= 2 * width;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      /* XXX: Rearrange the bytes according to FT_PIXEL_MODE_LCD.    */
      /* XXX: It is more efficient to render every third byte above. */

      if ( FT_ALLOC( temp, (FT_ULong)pitch ) )
        goto Exit;

      for ( i = 0; i < height; i++ )
      {
        line = bitmap->buffer + i * (FT_ULong)pitch;
        for ( j = 0; j < width; j++ )
        {
          temp[3 * j    ] = line[j];
          temp[3 * j + 1] = line[j + width];
          temp[3 * j + 2] = line[j + width + width];
        }
        FT_MEM_COPY( line, temp, pitch );
      }

      FT_FREE( temp );
    }
    else if ( vmul )  /* lcd_v */
    {
      int  pitch  = bitmap->pitch;


      /* Render 3 separate monochrome bitmaps, shifting the outline  */
      /* by 1/3 pixel. Triple the pitch to render on each third row. */
      bitmap->pitch *= 3;
      bitmap->rows  /= 3;

      bitmap->buffer += pitch;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline, 0,  21 );
      y_shift        += 21;
      bitmap->buffer += pitch;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline, 0, -42 );
      y_shift        -= 42;
      bitmap->buffer -= 2 * pitch;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      bitmap->pitch /= 3;
      bitmap->rows  *= 3;
    }
    else  /* grayscale */
      error = render->raster_render( render->raster, &params );

#endif /* !FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

  Exit:
    if ( !error )
    {
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    }
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }